

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::FormatString<char[37],char_const*,char[10],int,char[37],int,char[106]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [37],char **Args_1,
          char (*Args_2) [10],int *Args_3,char (*Args_4) [37],int *Args_5,char (*Args_6) [106])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[37],char_const*,char[10],int,char[37],int,char[106]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [37])this,(char **)Args,(char (*) [10])Args_1,(int *)Args_2,
             (char (*) [37])Args_3,(int *)Args_4,(char (*) [106])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}